

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall zmq::socket_base_t::process_stop(socket_base_t *this)

{
  mutex_t *in_RDI;
  scoped_lock_t lock;
  bool in_stack_0000004f;
  socket_base_t *in_stack_00000050;
  scoped_lock_t *in_stack_ffffffffffffffe0;
  
  scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffffe0,in_RDI);
  stop_monitor(in_stack_00000050,in_stack_0000004f);
  in_RDI[0x20]._mutex.__size[0x1c] = '\x01';
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x205348);
  return;
}

Assistant:

void zmq::socket_base_t::process_stop ()
{
    //  Here, someone have called zmq_ctx_term while the socket was still alive.
    //  We'll remember the fact so that any blocking call is interrupted and any
    //  further attempt to use the socket will return ETERM. The user is still
    //  responsible for calling zmq_close on the socket though!
    scoped_lock_t lock (_monitor_sync);
    stop_monitor ();

    _ctx_terminated = true;
}